

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filters.cpp
# Opt level: O1

void __thiscall
helics::CloningFilter::CloningFilter(CloningFilter *this,Federate *ffed,string_view filtName)

{
  CloningFilter *pCVar1;
  undefined1 local_59;
  CloneFilterOperation *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_50;
  shared_ptr<helics::FilterOperations> local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  Interface::Interface((Interface *)this,ffed,(InterfaceHandle)0x9aac0f00,filtName);
  (this->super_Filter).cloning = false;
  (this->super_Filter).disableAssign = false;
  (this->super_Filter).filtOp.
  super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->super_Filter).filtOp.
  super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_Filter).super_Interface._vptr_Interface = (_func_int **)&PTR__Filter_005529e8;
  if (ffed != (Federate *)0x0) {
    local_38 = 0;
    uStack_30 = 0;
    pCVar1 = Federate::registerCloningFilter
                       (ffed,filtName,(string_view)ZEXT816(0),(string_view)ZEXT816(0));
    (this->super_Filter).super_Interface.handle.hid =
         (pCVar1->super_Filter).super_Interface.handle.hid;
  }
  local_58 = (CloneFilterOperation *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<helics::CloneFilterOperation,std::allocator<helics::CloneFilterOperation>>
            (&_Stack_50,&local_58,(allocator<helics::CloneFilterOperation> *)&local_59);
  local_48.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &local_58->super_FilterOperations;
  local_48.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Stack_50._M_pi;
  local_58 = (CloneFilterOperation *)0x0;
  _Stack_50._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Filter::setFilterOperations(&this->super_Filter,&local_48);
  if (local_48.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<helics::FilterOperations,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (_Stack_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_50._M_pi);
  }
  return;
}

Assistant:

CloningFilter::CloningFilter(Federate* ffed, std::string_view filtName):
    Filter(ffed, filtName, InterfaceHandle())
{
    if (ffed != nullptr) {
        handle = ffed->registerCloningFilter(filtName);
    }
    setFilterOperations(std::make_shared<CloneFilterOperation>());
}